

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O2

int append_str(char *buf,char *new_str,int is_plur)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((new_str != (char *)0x0) && (*new_str != '\0')) {
    sVar1 = strlen(buf);
    iVar2 = 0xff - (int)sVar1;
    if (*buf != '\0') {
      strncat(buf," on ",(long)iVar2);
      iVar2 = 0xfb - (int)sVar1;
    }
    if (is_plur == 0) {
      new_str = an(new_str);
    }
    strncat(buf,new_str,(long)iVar2);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int append_str(char *buf, const char *new_str, int is_plur)
{
    int space_left;	/* space remaining in buf */

    if (!new_str || !new_str[0])
	return 0;
    
    space_left = BUFSZ - strlen(buf) - 1;
    if (buf[0]) {
	strncat(buf, " on ", space_left);
	space_left -= 4;
    }
    
    if (is_plur)
	strncat(buf, new_str, space_left);
    else
	strncat(buf, an(new_str), space_left);
    
    return 1;
}